

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase258::run(TestCase258 *this)

{
  bool bVar1;
  __pid_t _Var2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char buf [4];
  Array<char> local_98;
  uint local_7c;
  unsigned_long local_78;
  PipeThread pipeThread;
  Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface>
  local_50;
  AsyncIoContext ioContext;
  
  setupAsyncIo();
  local_50.ptr = (Iface *)operator_new(0x10);
  (local_50.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0041f0d0;
  local_50.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<kj::(anonymous_namespace)::TestCase258::run()::$_0>>
        ::instance;
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[4])(&pipeThread,ioContext.provider.ptr);
  Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface>::
  dispose(&local_50);
  (*((pipeThread.pipe.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[1])
            (&local_98,pipeThread.pipe.ptr,buf,3,4);
  _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_98,ioContext.waitScope);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_98);
  if ((CONCAT44(extraout_var,_Var2) != 3) && (_::Debug::minSeverity < 3)) {
    local_7c = 3;
    (*((pipeThread.pipe.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              (&local_98,pipeThread.pipe.ptr,buf,3,4);
    _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_98,ioContext.waitScope);
    local_78 = CONCAT44(extraout_var_00,_Var2);
    _::Debug::log<char_const(&)[89],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x110,ERROR,
               "\"failed: expected \" \"(3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))\", 3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope)"
               ,(char (*) [89])
                "failed: expected (3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))"
               ,&local_7c,&local_78);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_98);
  }
  heapString((String *)&local_98,buf,3);
  bVar1 = kj::operator==("foo",(String *)&local_98);
  Array<char>::~Array(&local_98);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    heapString((String *)&local_98,buf,3);
    _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x111,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (heapString(buf, 3))\", \"foo\", heapString(buf, 3)"
               ,(char (*) [49])"failed: expected (\"foo\") == (heapString(buf, 3))",
               (char (*) [4])0x357ec7,(String *)&local_98);
    Array<char>::~Array(&local_98);
  }
  (**((pipeThread.pipe.ptr)->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_98,&(pipeThread.pipe.ptr)->super_AsyncOutputStream,"bar",3);
  Promise<void>::wait((Promise<void> *)&local_98,ioContext.waitScope);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_98);
  (*((pipeThread.pipe.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[1])
            (&local_98,pipeThread.pipe.ptr,buf,1,1);
  _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_98,ioContext.waitScope);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_98);
  if ((CONCAT44(extraout_var_01,_Var2) != 0) && (_::Debug::minSeverity < 3)) {
    local_7c = 0;
    (*((pipeThread.pipe.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              (&local_98,pipeThread.pipe.ptr,buf,1,1);
    _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_98,ioContext.waitScope);
    local_78 = CONCAT44(extraout_var_02,_Var2);
    _::Debug::log<char_const(&)[88],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x116,ERROR,
               "\"failed: expected \" \"(0) == (pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope))\", 0, pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope)"
               ,(char (*) [88])
                "failed: expected (0) == (pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope))"
               ,(int *)&local_7c,&local_78);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_98);
  }
  AsyncIoProvider::PipeThread::~PipeThread(&pipeThread);
  AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(AsyncIo, PipeThreadDisconnects) {
  // Like above, but in this case we expect the main thread to detect the pipe thread disconnecting.

  auto ioContext = setupAsyncIo();

  auto pipeThread = ioContext.provider->newPipeThread(
      [](AsyncIoProvider& ioProvider, AsyncIoStream& stream, WaitScope& waitScope) {
    char buf[4];
    stream.write("foo", 3).wait(waitScope);
    EXPECT_EQ(3u, stream.tryRead(buf, 3, 4).wait(waitScope));
    EXPECT_EQ("bar", heapString(buf, 3));
  });

  char buf[4];
  EXPECT_EQ(3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope));
  EXPECT_EQ("foo", heapString(buf, 3));

  pipeThread.pipe->write("bar", 3).wait(ioContext.waitScope);

  // Expect disconnect.
  EXPECT_EQ(0, pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope));
}